

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O1

int __thiscall
CVmObjVector::getp_remove_element(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  char *pcVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  vm_val_t *pvVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  size_t idx;
  ulong uVar9;
  vm_val_t ele_val;
  vm_val_t local_40;
  
  if (getp_remove_element(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_remove_element();
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,argc,&getp_remove_element::desc);
  pvVar5 = sp_;
  if (iVar6 == 0) {
    retval->typ = VM_OBJ;
    (retval->val).obj = self;
    pvVar4 = sp_;
    uVar3 = *(undefined4 *)&retval->field_0x4;
    aVar2 = retval->val;
    sp_ = sp_ + 1;
    pvVar4->typ = retval->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    uVar8 = (ulong)*(ushort *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 2);
    if (uVar8 == 0) {
      idx = 0;
    }
    else {
      lVar7 = 4;
      idx = 0;
      uVar9 = 0;
      do {
        pcVar1 = (this->super_CVmObjCollection).super_CVmObject.ext_;
        local_40.typ = (vm_datatype_t)pcVar1[lVar7];
        vmb_get_dh_val(pcVar1 + lVar7,&local_40);
        iVar6 = vm_val_t::equals(&local_40,pvVar5 + -1,0);
        if (iVar6 == 0) {
          if (uVar9 != idx) {
            set_element_undo(this,self,idx,&local_40);
          }
          idx = idx + 1;
        }
        uVar9 = uVar9 + 1;
        lVar7 = lVar7 + 5;
      } while (uVar8 != uVar9);
    }
    if (idx != uVar8) {
      set_element_count_undo(this,self,idx);
    }
    sp_ = sp_ + -2;
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_remove_element(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *argc)
{
    vm_val_t *del_val;
    static CVmNativeCodeDesc desc(1);
    size_t src;
    size_t dst;
    size_t old_cnt;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the value to be removed */
    del_val = G_stk->get(0);

    /* the return value is 'self'; leave it on the stack */
    retval->set_obj(self);
    G_stk->push(retval);

    /* get the original number of elements */
    old_cnt = get_element_count();

    /* delete each element matching the given value */
    for (src = dst = 0 ; src < old_cnt ; ++src)
    {
        vm_val_t ele_val;

        /* get this element */
        get_element(src, &ele_val);

        /* 
         *   if this element doesn't match the value to be deleted, add it
         *   to the result vector 
         */
        if (!ele_val.equals(vmg_ del_val))
        {
            /* 
             *   This element is a keeper - if we're moving it to a new
             *   position (i.e., we've deleted any elements before this
             *   one), store it at its new position, keeping undo
             *   information.  If we're storing it at its same position,
             *   there's no need to re-store the value or keep any undo,
             *   since no change is involved.  
             */
            if (dst != src)
                set_element_undo(vmg_ self, dst, &ele_val);

            /* increment the write index past this element */
            ++dst;
        }
    }

    /* if the element count changed, set the new element count */
    if (dst != old_cnt)
        set_element_count_undo(vmg_ self, dst);

    /* discard gc protection and arguments */
    G_stk->discard(2);

    /* handled */
    return TRUE;
}